

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tick.cpp
# Opt level: O2

Tick Js::Tick::Now(void)

{
  Tick local_28;
  LARGE_INTEGER local_20;
  uint64 luCurrent;
  
  local_20.QuadPart = s_luBegin;
  QueryPerformanceCounter(&local_20);
  local_20.QuadPart = s_DEBUG_luSkip + s_DEBUG_luStart + local_20.QuadPart;
  Tick(&local_28,local_20.QuadPart - s_luBegin);
  return (Tick)local_28.m_luTick;
}

Assistant:

Tick Tick::Now()
    {
        // Determine our current time
        uint64 luCurrent = s_luBegin;
        /* Verify( */ QueryPerformanceCounter((LARGE_INTEGER *) &luCurrent);

#if DBG
        luCurrent += s_DEBUG_luStart + s_DEBUG_luSkip;
#endif

        // Create a Tick instance, using our delta since we started tracking time.
        uint64 luDelta = luCurrent - s_luBegin;
        return Tick(luDelta);
    }